

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

LINK_ENDPOINT_INSTANCE * find_link_endpoint_by_name(SESSION_INSTANCE *session,char *name)

{
  uint uVar1;
  LINK_ENDPOINT_INSTANCE **ppLVar2;
  int iVar3;
  ulong uVar4;
  LINK_ENDPOINT_INSTANCE *pLVar5;
  
  uVar1 = session->link_endpoint_count;
  if ((ulong)uVar1 == 0) {
    uVar4 = 0;
LAB_0017247c:
    if ((uint)uVar4 == uVar1) {
      pLVar5 = (LINK_ENDPOINT_INSTANCE *)0x0;
    }
    else {
      pLVar5 = session->link_endpoints[uVar4 & 0xffffffff];
    }
  }
  else {
    ppLVar2 = session->link_endpoints;
    pLVar5 = (LINK_ENDPOINT_INSTANCE *)0x0;
    uVar4 = 0;
    do {
      iVar3 = strcmp(ppLVar2[uVar4]->name,name);
      if (iVar3 == 0) goto LAB_0017247c;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return pLVar5;
}

Assistant:

static LINK_ENDPOINT_INSTANCE* find_link_endpoint_by_name(SESSION_INSTANCE* session, const char* name)
{
    uint32_t i;
    LINK_ENDPOINT_INSTANCE* result;

    for (i = 0; i < session->link_endpoint_count; i++)
    {
        if (strcmp(session->link_endpoints[i]->name, name) == 0)
        {
            break;
        }
    }

    if (i == session->link_endpoint_count)
    {
        result = NULL;
    }
    else
    {
        result = session->link_endpoints[i];
    }

    return result;
}